

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O3

int ffcopy(fitsfile *infptr,fitsfile *outfptr,int morekeys,int *status)

{
  uint uVar1;
  int iVar2;
  int nspace;
  undefined8 uStack_28;
  
  uVar1 = *status;
  uStack_28 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  if (infptr == outfptr) {
    *status = 0x65;
    return 0x65;
  }
  iVar2 = ffcphd(infptr,outfptr,status);
  if (iVar2 < 1) {
    if (morekeys < 1) {
      iVar2 = ffghsp(infptr,(int *)0x0,(int *)((long)&uStack_28 + 4),status);
      if (0 < iVar2) goto LAB_0011f28c;
      if (0 < uStack_28._4_4_) {
        ffhdef(outfptr,uStack_28._4_4_,status);
        if (0x22 < uStack_28._4_4_) {
          ffwend(outfptr,status);
        }
      }
    }
    else {
      ffhdef(outfptr,morekeys,status);
    }
    ffcpdt(infptr,outfptr,status);
  }
LAB_0011f28c:
  return *status;
}

Assistant:

int ffcopy(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int morekeys,        /* I - reserve space in output header   */
           int *status)         /* IO - error status     */
/*
  copy the CHDU from infptr to the CHDU of outfptr.
  This will also allocate space in the output header for MOREKY keywords
*/
{
    int nspace;
    
    if (*status > 0)
        return(*status);

    if (infptr == outfptr)
        return(*status = SAME_FILE);

    if (ffcphd(infptr, outfptr, status) > 0)  /* copy the header keywords */
       return(*status);

    if (morekeys > 0) {
      ffhdef(outfptr, morekeys, status); /* reserve space for more keywords */

    } else {
        if (ffghsp(infptr, NULL, &nspace, status) > 0) /* get existing space */
            return(*status);

        if (nspace > 0) {
            ffhdef(outfptr, nspace, status); /* preserve same amount of space */
            if (nspace >= 35) {  

	        /* There is at least 1 full empty FITS block in the header. */
	        /* Physically write the END keyword at the beginning of the */
	        /* last block to preserve this extra space now rather than */
		/* later.  This is needed by the stream: driver which cannot */
		/* seek back to the header to write the END keyword later. */

	        ffwend(outfptr, status);
            }
        }
    }

    ffcpdt(infptr, outfptr, status);  /* now copy the data unit */

    return(*status);
}